

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheFunction.hpp
# Opt level: O2

uint32_t __thiscall
CacheFunction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/tests/CacheFunctionTest.cpp:26:12),_std::function<double_(double)>_>
::inspect(CacheFunction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_libKriging[P]libKriging_tests_CacheFunctionTest_cpp:26:12),_std::function<double_(double)>_>
          *this,double args)

{
  uint32_t uVar1;
  iterator iVar2;
  HashKey arg_key;
  HashKey local_10;
  
  local_10 = hash_args(this,args);
  iVar2 = Catch::clara::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_10);
  if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false>._M_cur ==
      (__node_type *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(uint32_t *)
             ((long)iVar2.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false>.
                    _M_cur + 0x10);
  }
  return uVar1;
}

Assistant:

auto inspect(Args... args) -> uint32_t {
    const auto arg_key = hash_args(args...);
    const auto finder = m_cache_hit.find(arg_key);
    return (finder == m_cache_hit.end()) ? 0 : finder->second;
  }